

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O2

bool __thiscall diffusion::Tokenizer::is_empty(Tokenizer *this)

{
  _Elt_pointer pvVar1;
  _Elt_pointer pvVar2;
  
  std::mutex::lock(&this->queue_mutex_);
  pvVar1 = (this->processed_data_queue_).
           super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pvVar2 = (this->processed_data_queue_).
           super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  return pvVar1 == pvVar2;
}

Assistant:

bool is_empty() const {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        return processed_data_queue_.empty();
    }